

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::DumpScopes(FunctionBody *this)

{
  int iVar1;
  ScopeObjectChain *pSVar2;
  undefined4 extraout_var;
  char16 *pcVar3;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar4;
  wchar local_68 [4];
  char16 debugStringBuffer [42];
  FunctionBody *this_local;
  
  unique0x100000d0 = this;
  pSVar2 = GetScopeObjectChain(this);
  if (pSVar2 != (ScopeObjectChain *)0x0) {
    iVar1 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar3 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_68);
    Output::Print(L"%s (%s) :\n",CONCAT44(extraout_var,iVar1),pcVar3);
    pSVar2 = GetScopeObjectChain(this);
    pLVar4 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&pSVar2->pScopeChain);
    JsUtil::List<Js::DebuggerScope*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::
    Map<Js::FunctionBody::DumpScopes()::__0>
              ((List<Js::DebuggerScope*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                *)pLVar4);
  }
  return;
}

Assistant:

void FunctionBody::DumpScopes()
    {
        if(this->GetScopeObjectChain())
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("%s (%s) :\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
            this->GetScopeObjectChain()->pScopeChain->Map( [=] (uint index, DebuggerScope* scope )
            {
                scope->Dump();
            });
        }
    }